

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_controller_io.h
# Opt level: O0

uint8_t __thiscall
n_e_s::core::MemBankControllerIO::read_byte(MemBankControllerIO *this,uint16_t addr)

{
  uint uVar1;
  bool local_2b;
  uint8_t local_29;
  uint8_t btn;
  uint8_t data;
  INesController *pIStack_28;
  uint8_t read_cnt;
  INesController *controller;
  uint16_t addr_local;
  MemBankControllerIO *this_local;
  
  if (addr == this->controller1_addr_) {
    pIStack_28 = this->controller1_;
    local_29 = this->read_cnt1_;
    this->read_cnt1_ = local_29 + '\x01';
  }
  else {
    if (addr != this->controller2_addr_) {
      return '\0';
    }
    pIStack_28 = this->controller2_;
    local_29 = this->read_cnt2_;
    this->read_cnt2_ = local_29 + '\x01';
  }
  if ((this->data1_ & 1) == 1) {
    uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,0);
    local_2b = (uVar1 & 1) != 0;
  }
  else {
    switch(local_29) {
    case '\0':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,0);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\x01':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,1);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\x02':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,2);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\x03':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,3);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\x04':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,4);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\x05':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,5);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\x06':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,6);
      local_2b = (uVar1 & 1) != 0;
      break;
    case '\a':
      uVar1 = (*pIStack_28->_vptr_INesController[3])(pIStack_28,7);
      local_2b = (uVar1 & 1) != 0;
      break;
    default:
      local_2b = true;
    }
  }
  this_local._7_1_ = local_2b | 0x40;
  return this_local._7_1_;
}

Assistant:

uint8_t read_byte(uint16_t addr) const override {
        // Source: https://wiki.nesdev.com/w/index.php/Standard_controller
        // In the NES and Famicom, the top three (or five) bits are not
        // driven, and so retain the bits of the previous byte on the bus.
        // Usually this is the most significant byte of the address of the
        // controller port—0x40. Certain games (such as Paperboy) rely on
        // this behavior and require that reads from the controller ports
        // return exactly $40 or $41 as appropriate.

        INesController *controller{};
        uint8_t read_cnt{0};

        if (addr == controller1_addr_) {
            controller = controller1_;
            read_cnt = read_cnt1_++;
        } else if (addr == controller2_addr_) {
            controller = controller2_;
            read_cnt = read_cnt2_++;
        } else {
            return 0x00;
        }

        uint8_t data = 0x40;
        uint8_t btn = 0x00;

        // Special case, if strobe (0x4016, bit 1) is high, always return button
        // A for each controller
        if ((data1_ & static_cast<uint8_t>(0x01)) == 0x01) {
            btn = controller->get(INesController::Button::A) ? 0x01 : 0x00;
            return static_cast<uint8_t>(data & static_cast<uint8_t>(0xFE)) |
                   btn;
        }

        switch (read_cnt) {
        case 0:
            btn = controller->get(INesController::Button::A) ? 0x01 : 0x00;
            break;
        case 1:
            btn = controller->get(INesController::Button::B) ? 0x01 : 0x00;
            break;
        case 2:
            btn = controller->get(INesController::Button::Select) ? 0x01 : 0x00;
            break;
        case 3:
            btn = controller->get(INesController::Button::Start) ? 0x01 : 0x00;
            break;
        case 4:
            btn = controller->get(INesController::Button::Up) ? 0x01 : 0x00;
            break;
        case 5:
            btn = controller->get(INesController::Button::Down) ? 0x01 : 0x00;
            break;
        case 6:
            btn = controller->get(INesController::Button::Left) ? 0x01 : 0x00;
            break;
        case 7:
            btn = controller->get(INesController::Button::Right) ? 0x01 : 0x00;
            break;
        default:
            btn = 0x01; // After 8th read, return 1 for official Nintendo
                        // controllers
        }
        data = static_cast<uint8_t>(data & static_cast<uint8_t>(0xFE)) | btn;
        return data;
    }